

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

string * polyscope::prettyPrintCount_abi_cxx11_(size_t count)

{
  undefined1 auVar1 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  ulong in_RSI;
  string *in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  char buf [50];
  string postfix;
  double countD;
  size_t iPow;
  size_t iPostfix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postFixes;
  int nDigits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  double dVar8;
  char *in_stack_fffffffffffffd48;
  char *pcVar9;
  allocator *in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd68;
  allocator *paVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd70;
  iterator in_stack_fffffffffffffd78;
  size_type in_stack_fffffffffffffd80;
  string *local_238;
  allocator local_1c2;
  allocator local_1c1;
  undefined4 local_1c0;
  allocator local_1b9;
  char local_1b8 [56];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  double local_120;
  long local_118;
  ulong local_110;
  undefined1 local_101;
  allocator local_100;
  allocator local_ff;
  allocator local_fe;
  allocator local_fd [20];
  allocator local_e9;
  string *local_e8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string *local_40;
  undefined8 local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  int local_14;
  ulong local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_14 = 1;
  local_10 = in_RSI;
  if (in_RSI != 0) {
    auVar6._0_8_ = std::log10<unsigned_long>(0x3d9dad);
    auVar6._8_56_ = extraout_var;
    auVar1 = vroundsd_avx(auVar6._0_16_,auVar6._0_16_,9);
    local_14 = (int)(auVar1._0_8_ + 1.0);
  }
  if (local_14 < 5) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd78);
  }
  else {
    local_101 = 1;
    local_e8 = local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"",&local_e9);
    local_e8 = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"K",local_fd);
    local_e8 = local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"M",&local_fe);
    local_e8 = local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"B",&local_ff);
    local_e8 = local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"T",&local_100);
    local_101 = 0;
    local_40 = local_e0;
    local_38 = 5;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x3d9faa);
    __l._M_len = in_stack_fffffffffffffd80;
    __l._M_array = in_stack_fffffffffffffd78;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffd70,__l,in_stack_fffffffffffffd68);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x3d9fde);
    local_238 = (string *)&local_40;
    do {
      local_238 = local_238 + -0x20;
      std::__cxx11::string::~string(local_238);
    } while (local_238 != local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff);
    std::allocator<char>::~allocator((allocator<char> *)&local_fe);
    std::allocator<char>::~allocator((allocator<char> *)local_fd);
    auVar7._0_8_ = std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    auVar7._8_56_ = extraout_var_00;
    local_110 = 0;
    local_118 = 0;
    auVar1 = vcvtusi2sd_avx512f(auVar7._0_16_,local_10);
    local_120 = auVar1._0_8_;
    for (; 3 < local_14; local_14 = local_14 + -3) {
      local_10 = local_10 / 1000;
      local_120 = local_120 / 1000.0;
      local_110 = local_110 + 1;
      local_118 = local_118 + 3;
    }
    std::__cxx11::string::string(local_140);
    uVar2 = local_110;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_30);
    if (uVar2 < sVar3) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_30,local_110);
      std::__cxx11::string::operator=(local_140,(string *)pvVar4);
    }
    else {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd78);
      std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      std::__cxx11::string::operator=(local_140,local_160);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_180);
    }
    dVar8 = local_120;
    if (local_14 == 1) {
      uVar5 = std::__cxx11::string::c_str();
      pcVar9 = local_1b8;
      snprintf(pcVar9,0x32,"%2.2f%s",dVar8,uVar5);
      paVar10 = &local_1b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar9,paVar10);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    }
    else if (local_14 == 2) {
      uVar5 = std::__cxx11::string::c_str();
      snprintf(local_1b8,0x32,"%2.1f%s",dVar8,uVar5);
      paVar10 = &local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,local_1b8,paVar10);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    }
    else {
      uVar5 = std::__cxx11::string::c_str();
      pcVar9 = local_1b8;
      snprintf(pcVar9,0x32,"%2.0f%s",dVar8,uVar5);
      in_stack_fffffffffffffd50 = &local_1c2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar9,in_stack_fffffffffffffd50);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c2);
    }
    local_1c0 = 1;
    std::__cxx11::string::~string(local_140);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd50);
  }
  return in_RDI;
}

Assistant:

std::string prettyPrintCount(size_t count) {

  int nDigits = 1;
  if (count > 0) {
    nDigits = 1 + std::floor(std::log10(count));
  }

  // Print small values exactly
  if (nDigits <= 4) {
    return std::to_string(count);
  }

  std::vector<std::string> postFixes = {"", "K", "M", "B", "T"};
  size_t iPostfix = 0;
  size_t iPow = 0;
  double countD = count;

  while (nDigits > 3) {
    count /= 1000;
    countD /= 1000;
    iPostfix++;
    iPow += 3;
    nDigits -= 3;
  }

  // Get a postfix, either as a predefined character or scientific notation
  std::string postfix;
  if (iPostfix < postFixes.size()) {
    postfix = postFixes[iPostfix];
  } else {
    postfix = "*10^" + std::to_string(iPow);
  }

  // Build the actual string
  char buf[50];
  if (nDigits == 1) {
    snprintf(buf, 50, "%2.2f%s", countD, postfix.c_str());
    return std::string(buf);
  } else if (nDigits == 2) {
    snprintf(buf, 50, "%2.1f%s", countD, postfix.c_str());
    return std::string(buf);
  } else /*(nDigits == 3) */ {
    snprintf(buf, 50, "%2.0f%s", countD, postfix.c_str());
    return std::string(buf);
  }
}